

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

void anon_unknown.dwarf_11cc7::string_arg(string *option,int i,int argc,char **argv,char *arg)

{
  if (i != argc) {
    std::__cxx11::string::assign((char *)option);
    return;
  }
  insufficient_args(arg);
  return;
}

Assistant:

void string_arg(std::string &option, int i,
    int argc, char *argv[], const char *arg)
{
    if (i == argc)
    {
        insufficient_args(arg);
    }
    option = argv[i];
}